

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

Expression * __thiscall hdc::Parser::parse_bitwise_xor_expression(Parser *this)

{
  bool bVar1;
  Expression *left;
  Expression *this_00;
  Expression *right;
  Token oper;
  
  oper.lexem._M_dataplus._M_p = (pointer)&oper.lexem.field_2;
  oper.lexem._M_string_length = 0;
  oper.lexem.field_2._M_local_buf[0] = '\0';
  left = parse_bitwise_and_expression(this);
  while( true ) {
    bVar1 = match(this,TK_BITWISE_XOR);
    if (!bVar1) break;
    Token::operator=(&oper,(this->matched)._M_current);
    this_00 = (Expression *)operator_new(0x68);
    right = parse_bitwise_and_expression(this);
    BitwiseXorExpression::BitwiseXorExpression((BitwiseXorExpression *)this_00,&oper,left,right);
    left = this_00;
  }
  std::__cxx11::string::~string((string *)&oper.lexem);
  return left;
}

Assistant:

Expression* Parser::parse_bitwise_xor_expression() {
    Token oper;
    Expression* expression = parse_bitwise_and_expression();

    while (true) {
        if (match(TK_BITWISE_XOR)) {
            oper = *matched;
            expression = new BitwiseXorExpression(oper, expression, parse_bitwise_and_expression());
        } else {
            break;
        }
    }

    return expression;
}